

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicketSystem.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  UserManager *this;
  TrainManager *this_00;
  OrderManager *this_01;
  ostream *poVar4;
  undefined1 *puVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  string tmp;
  string ord;
  string argv [100];
  undefined1 *local_d18;
  ulong local_d10;
  undefined1 local_d08;
  undefined7 uStack_d07;
  undefined1 *local_cf8;
  undefined8 local_cf0;
  undefined1 local_ce8;
  undefined7 uStack_ce7;
  long *local_cd8 [2];
  long local_cc8 [2];
  string local_cb8 [99];
  long local_58 [5];
  
  lVar3 = 0x10;
  do {
    puVar5 = (undefined1 *)((long)&local_cb8[0]._M_dataplus._M_p + lVar3);
    *(undefined1 **)((long)local_cc8 + lVar3) = puVar5;
    *(undefined8 *)((long)local_cc8 + lVar3 + 8) = 0;
    *puVar5 = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xc90);
  this = (UserManager *)operator_new(0x20);
  sjtu::UserManager::init(this,(EVP_PKEY_CTX *)0x0);
  this_00 = (TrainManager *)operator_new(0x28);
  sjtu::TrainManager::init(this_00,(EVP_PKEY_CTX *)0x0);
  this_01 = (OrderManager *)operator_new(0x18);
  this_01->pending_id = 0;
  sjtu::OrderManager::init(this_01,(EVP_PKEY_CTX *)0x0);
  do {
    local_d18 = &local_d08;
    local_d10 = 0;
    local_d08 = 0;
    local_cf8 = &local_ce8;
    local_cf0 = 0;
    local_ce8 = 0;
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_d18,cVar2);
    while ((local_d18[local_d10 - 1] == '\n' || (local_d18[local_d10 - 1] == '\r'))) {
      std::__cxx11::string::pop_back();
    }
    if (local_d10 == 0) {
      iVar10 = 0;
    }
    else {
      uVar7 = 0;
      iVar10 = 0;
      iVar9 = 0;
      do {
        uVar6 = (ulong)iVar9;
        iVar8 = iVar9;
        if (uVar6 < local_d10) {
          do {
            if (local_d18[uVar6] == ' ') break;
            uVar6 = uVar6 + 1;
          } while (uVar6 < local_d10);
          iVar8 = (int)uVar6;
        }
        if (iVar9 == 0) {
          std::__cxx11::string::string((string *)local_cd8,(string *)&local_d18,uVar7,uVar6);
          std::__cxx11::string::operator=((string *)&local_cf8,(string *)local_cd8);
          if (local_cd8[0] != local_cc8) {
            operator_delete(local_cd8[0],local_cc8[0] + 1);
          }
        }
        else {
          std::__cxx11::string::string
                    ((string *)local_cd8,(string *)&local_d18,uVar7,(long)(iVar8 - iVar9));
          std::__cxx11::string::operator=((string *)(local_cb8 + iVar10),(string *)local_cd8);
          if (local_cd8[0] != local_cc8) {
            operator_delete(local_cd8[0],local_cc8[0] + 1);
          }
          iVar10 = iVar10 + 1;
        }
        iVar9 = iVar8 + 1;
        uVar7 = (ulong)iVar9;
      } while (uVar7 < local_d10);
    }
    iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
    if (iVar9 == 0) {
      bVar1 = true;
      sjtu::UserManager::add_user(this,iVar10,local_cb8);
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
      if (iVar9 == 0) {
        bVar1 = true;
        sjtu::UserManager::login(this,iVar10,local_cb8);
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
        if (iVar9 == 0) {
          bVar1 = true;
          sjtu::UserManager::logout(this,iVar10,local_cb8);
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
          if (iVar9 == 0) {
            bVar1 = true;
            sjtu::UserManager::query_profile(this,iVar10,local_cb8);
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
            if (iVar9 == 0) {
              bVar1 = true;
              sjtu::UserManager::modify_profile(this,iVar10,local_cb8);
            }
            else {
              iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
              if (iVar9 == 0) {
                bVar1 = true;
                sjtu::TrainManager::add_train(this_00,iVar10,local_cb8);
              }
              else {
                iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
                if (iVar9 == 0) {
                  bVar1 = true;
                  sjtu::TrainManager::release_train(this_00,iVar10,local_cb8);
                }
                else {
                  iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
                  if (iVar9 == 0) {
                    bVar1 = true;
                    sjtu::TrainManager::query_train(this_00,iVar10,local_cb8);
                  }
                  else {
                    iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
                    if (iVar9 == 0) {
                      bVar1 = true;
                      sjtu::TrainManager::delete_train(this_00,iVar10,local_cb8);
                    }
                    else {
                      iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
                      if (iVar9 == 0) {
                        bVar1 = true;
                        sjtu::TrainManager::query_ticket(this_00,iVar10,local_cb8);
                      }
                      else {
                        iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
                        if (iVar9 == 0) {
                          bVar1 = true;
                          sjtu::TrainManager::query_transfer(this_00,iVar10,local_cb8);
                        }
                        else {
                          iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
                          if (iVar9 == 0) {
                            bVar1 = true;
                            sjtu::OrderManager::buy_ticket(this_01,this,this_00,iVar10,local_cb8);
                          }
                          else {
                            iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
                            if (iVar9 == 0) {
                              bVar1 = true;
                              sjtu::UserManager::query_order(this,this_01,iVar10,local_cb8);
                            }
                            else {
                              iVar9 = std::__cxx11::string::compare((char *)&local_cf8);
                              if (iVar9 == 0) {
                                bVar1 = true;
                                sjtu::OrderManager::refund_ticket
                                          (this_01,this,this_00,iVar10,local_cb8);
                              }
                              else {
                                iVar10 = std::__cxx11::string::compare((char *)&local_cf8);
                                if (iVar10 == 0) {
                                  sjtu::UserManager::init(this,(EVP_PKEY_CTX *)0x1);
                                  sjtu::TrainManager::init(this_00,(EVP_PKEY_CTX *)0x1);
                                  sjtu::OrderManager::init(this_01,(EVP_PKEY_CTX *)0x1);
                                  poVar4 = (ostream *)
                                           std::ostream::operator<<((ostream *)&std::cout,0);
                                  bVar1 = true;
                                  std::endl<char,std::char_traits<char>>(poVar4);
                                }
                                else {
                                  iVar10 = std::__cxx11::string::compare((char *)&local_cf8);
                                  bVar1 = true;
                                  if (iVar10 == 0) {
                                    sjtu::UserManager::~UserManager(this);
                                    operator_delete(this,0x20);
                                    sjtu::TrainManager::~TrainManager(this_00);
                                    operator_delete(this_00,0x28);
                                    sjtu::OrderManager::~OrderManager(this_01);
                                    operator_delete(this_01,0x18);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"bye",3);
                                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                                    bVar1 = false;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (local_cf8 != &local_ce8) {
      operator_delete(local_cf8,CONCAT71(uStack_ce7,local_ce8) + 1);
    }
    if (local_d18 != &local_d08) {
      operator_delete(local_d18,CONCAT71(uStack_d07,local_d08) + 1);
    }
    if (!bVar1) {
      lVar3 = -0xc80;
      plVar11 = local_58 + 2;
      do {
        if (plVar11 != (long *)plVar11[-2]) {
          operator_delete((long *)plVar11[-2],*plVar11 + 1);
        }
        plVar11 = plVar11 + -4;
        lVar3 = lVar3 + 0x20;
      } while (lVar3 != 0);
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
	/*std::ifstream in("data/3.in");
	std::cin.rdbuf(in.rdbuf());
	std::ofstream out("3.out");
	std::cout.rdbuf(out.rdbuf());*/
    std::string argv[100];
    int argc = 0, l, r;
    sjtu::UserManager *user_manager;
    sjtu::TrainManager *train_manager;
    sjtu::OrderManager *order_manager;
    user_manager = new sjtu::UserManager;
    train_manager = new sjtu::TrainManager;
    order_manager = new sjtu::OrderManager;
    while(1) {
        std::string tmp, ord;
        for (getline(std::cin, tmp);tmp.back() == '\r' || tmp.back() == '\n';tmp.pop_back());
        argc = 0;
        for (l = 0; l < tmp.length(); l = r + 1) {
            for (r = l; r < tmp.length() && tmp[r] != ' '; ++r);
            if (l != 0) argv[argc++] = std::string(tmp, l, r - l);
            else ord = std::string(tmp, l, r - l);
        }
        if(ord == "add_user") user_manager->add_user(argc, argv);
        else if (ord == "login") user_manager->login(argc, argv);
        else if (ord == "logout") user_manager->logout(argc, argv);
        else if (ord == "query_profile") user_manager->query_profile(argc, argv);
        else if (ord == "modify_profile") user_manager->modify_profile(argc, argv);
        else if (ord == "add_train") train_manager->add_train(argc, argv);
        else if (ord == "release_train") train_manager->release_train(argc, argv);
        else if (ord == "query_train") train_manager->query_train(argc, argv);
        else if (ord == "delete_train") train_manager->delete_train(argc, argv);
        else if (ord == "query_ticket") train_manager->query_ticket(argc, argv);
        else if (ord == "query_transfer") train_manager->query_transfer(argc, argv);
        else if (ord == "buy_ticket") order_manager->buy_ticket(user_manager, train_manager, argc, argv);
        else if (ord == "query_order") user_manager->query_order(order_manager, argc, argv);
        else if (ord == "refund_ticket") order_manager->refund_ticket(user_manager, train_manager, argc, argv);
        else if (ord == "clean") {
            user_manager->init(true);
            train_manager->init(true);
            order_manager->init(true);
            std::cout << 0 << std::endl;
        }
        else if (ord == "exit") {
            delete user_manager;
            delete train_manager;
            delete order_manager;
            std::cout << "bye" << std::endl;
            break;
        }
    }
    return 0;
}